

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

int luv_fs_access(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer lVar4;
  size_t sVar5;
  uv_fs_t *req;
  luv_req_t *plVar6;
  uv_loop_t *loop;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  uint uVar10;
  ulong uVar11;
  code *cb;
  uint flags;
  luv_req_t *data;
  
  pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  iVar1 = lua_isnumber(L,2);
  if (iVar1 == 0) {
    iVar1 = lua_isstring(L,2);
    if (iVar1 == 0) {
      pcVar7 = "Expected string or integer for file access mode check";
LAB_0014c04b:
      flags = luaL_argerror(L,2,pcVar7);
    }
    else {
      flags = 0;
      pcVar7 = lua_tolstring(L,2,(size_t *)0x0);
      sVar5 = strlen(pcVar7);
      if (sVar5 != 0) {
        flags = 0;
        sVar9 = 0;
        do {
          uVar11 = (ulong)((byte)pcVar7[sVar9] - 0x52);
          if (0x26 < (byte)pcVar7[sVar9] - 0x52) {
LAB_0014c1ad:
            pcVar7 = "Unknown character in access mode string";
            goto LAB_0014c04b;
          }
          if ((0x100000001U >> (uVar11 & 0x3f) & 1) == 0) {
            if ((0x2000000020U >> (uVar11 & 0x3f) & 1) == 0) {
              if ((0x4000000040U >> (uVar11 & 0x3f) & 1) == 0) goto LAB_0014c1ad;
              uVar10 = 1;
            }
            else {
              uVar10 = 2;
            }
          }
          else {
            uVar10 = 4;
          }
          flags = flags | uVar10;
          sVar9 = sVar9 + 1;
        } while (sVar5 != sVar9);
      }
    }
  }
  else {
    lVar4 = lua_tointegerx(L,2,(int *)0x0);
    flags = (uint)lVar4;
  }
  iVar1 = luv_check_continuation(L,3);
  req = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar6 = luv_setup_req(L,iVar1);
  req->data = plVar6;
  iVar1 = plVar6->callback_ref;
  loop = luv_loop(L);
  cb = (uv_fs_cb)0x0;
  if (iVar1 != -2) {
    cb = luv_fs_cb;
  }
  iVar2 = uv_fs_access(loop,req,pcVar3,flags,cb);
  if ((req->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
    if (iVar1 == -2) {
      iVar1 = push_fs_result(L,req);
      if (req->fs_type != UV_FS_SCANDIR) {
        luv_cleanup_req(L,(luv_req_t *)req->data);
        req->data = (void *)0x0;
        uv_fs_req_cleanup(req);
      }
    }
    else {
      lua_rawgeti(L,-0xf4628,(long)plVar6->req_ref);
      iVar1 = 1;
    }
  }
  else {
    lua_pushnil(L);
    pcVar3 = req->path;
    pcVar7 = uv_err_name((int)req->result);
    pcVar8 = uv_strerror((int)req->result);
    if (pcVar3 == (char *)0x0) {
      lua_pushfstring(L,"%s: %s",pcVar7,pcVar8);
    }
    else {
      lua_pushfstring(L,"%s: %s: %s",pcVar7,pcVar8,req->path);
    }
    pcVar3 = uv_err_name((int)req->result);
    lua_pushstring(L,pcVar3);
    luv_cleanup_req(L,(luv_req_t *)req->data);
    req->data = (void *)0x0;
    uv_fs_req_cleanup(req);
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

static int luv_fs_access(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  const char* path = luaL_checkstring(L, 1);
  int amode = luv_check_amode(L, 2);
  int ref = luv_check_continuation(L, 3);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  FS_CALL(access, req, path, amode);
}